

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineClearUtil.cpp
# Opt level: O2

IVec4 __thiscall vkt::pipeline::defaultClearColorInt(pipeline *this,TextureFormat *format)

{
  undefined8 extraout_RDX;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  IVec4 IVar5;
  Vec4 color;
  TextureFormatInfo formatInfo;
  Vector<float,_4> local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  tcu local_68 [16];
  TextureFormatInfo local_58;
  
  tcu::getTextureFormatInfo(&local_58,format);
  local_88.m_data[0] = 0.39;
  local_88.m_data[1] = 0.58;
  local_88.m_data[2] = 0.93;
  local_88.m_data[3] = 1.0;
  tcu::operator-(local_68,&local_88,&local_58.lookupBias);
  tcu::operator/((tcu *)&local_78,(Vector<float,_4> *)local_68,&local_58.lookupScale);
  fVar1 = floorf(fStack_6c + 0.5);
  fVar2 = floorf(fStack_70 + 0.5);
  fVar3 = floorf(local_78 + 0.5);
  fVar4 = floorf(fStack_74 + 0.5);
  *(int *)this = (int)fVar3;
  *(int *)(this + 4) = (int)fVar4;
  *(int *)(this + 8) = (int)fVar2;
  *(int *)(this + 0xc) = (int)fVar1;
  IVar5.m_data[2] = (int)extraout_RDX;
  IVar5.m_data[3] = (int)((ulong)extraout_RDX >> 0x20);
  IVar5.m_data._0_8_ = this;
  return (IVec4)IVar5.m_data;
}

Assistant:

tcu::IVec4 defaultClearColorInt (const tcu::TextureFormat& format)
{
	const tcu::TextureFormatInfo	formatInfo	= tcu::getTextureFormatInfo(format);
	const tcu::Vec4					color		= (defaultClearColorUnorm() - formatInfo.lookupBias) / formatInfo.lookupScale;

	const tcu::IVec4				result		((deInt32)deFloatRound(color.x()), (deInt32)deFloatRound(color.y()),
												 (deInt32)deFloatRound(color.z()), (deInt32)deFloatRound(color.w()));

	return result;
}